

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# KcpWithTcpClient.cpp
# Opt level: O1

void __thiscall
sznet::net::KcpWithTcpClient::newTcpConnection(KcpWithTcpClient *this,sz_sock sockfd)

{
  uint32_t *__return_storage_ptr__;
  __shared_count<(__gnu_cxx::_Lock_policy)2> *p_Var1;
  MutexLock *mutex;
  uint id;
  EventLoop *this_00;
  pointer pcVar2;
  undefined8 uVar3;
  bool bVar4;
  TcpConnection *this_01;
  undefined1 auStack_e8 [8];
  InetAddress peerAddr;
  char buf [32];
  InetAddress localAddr;
  string connName;
  TcpConnectionPtr conn;
  
  this_00 = this->m_loop;
  bVar4 = EventLoop::isInLoopThread(this_00);
  if (!bVar4) {
    EventLoop::abortNotInLoopThread(this_00);
  }
  sockets::sz_sock_getpeeraddr((sockaddr_in6 *)((long)&peerAddr.field_0 + 0x18),sockfd);
  peerAddr.field_0._12_1_ = buf[0xc];
  peerAddr.field_0._13_1_ = buf[0xd];
  peerAddr.field_0._14_1_ = buf[0xe];
  peerAddr.field_0._15_1_ = buf[0xf];
  peerAddr.field_0._16_1_ = buf[0x10];
  peerAddr.field_0._17_1_ = buf[0x11];
  peerAddr.field_0._18_1_ = buf[0x12];
  peerAddr.field_0._19_1_ = buf[0x13];
  auStack_e8 = (undefined1  [8])stack0xffffffffffffff38;
  id = this->m_nextConnId;
  this->m_nextConnId = id + 1;
  __return_storage_ptr__ = &localAddr.field_0.m_addr6.sin6_scope_id;
  InetAddress::toIpPort_abi_cxx11_((string *)__return_storage_ptr__,(InetAddress *)auStack_e8);
  snprintf((char *)&peerAddr.field_0.m_addr6.sin6_scope_id,0x20,":tcp-%s#%d",stack0xffffffffffffff78
           ,(ulong)id);
  if (stack0xffffffffffffff78 != &connName._M_string_length) {
    operator_delete(stack0xffffffffffffff78);
  }
  unique0x00004780 = &connName._M_string_length;
  pcVar2 = (this->m_name)._M_dataplus._M_p;
  std::__cxx11::string::_M_construct<char*>
            ((string *)__return_storage_ptr__,pcVar2,pcVar2 + (this->m_name)._M_string_length);
  std::__cxx11::string::append((char *)__return_storage_ptr__);
  sockets::sz_sock_getlocaladdr
            ((sockaddr_in6 *)
             &conn.super___shared_ptr<sznet::net::TcpConnection,_(__gnu_cxx::_Lock_policy)2>.
              _M_refcount,sockfd);
  buf._24_8_ = conn.super___shared_ptr<sznet::net::TcpConnection,_(__gnu_cxx::_Lock_policy)2>.
               _M_refcount._M_pi;
  this_01 = (TcpConnection *)operator_new(0x1d0);
  TcpConnection::TcpConnection
            (this_01,this->m_loop,(string *)((long)&localAddr.field_0 + 0x18),id,sockfd,
             (InetAddress *)(buf + 0x18),(InetAddress *)auStack_e8);
  std::__shared_ptr<sznet::net::TcpConnection,(__gnu_cxx::_Lock_policy)2>::
  __shared_ptr<sznet::net::TcpConnection,void>
            ((__shared_ptr<sznet::net::TcpConnection,(__gnu_cxx::_Lock_policy)2> *)
             (connName.field_2._M_local_buf + 8),this_01);
  uVar3 = connName.field_2._8_8_;
  conn.super___shared_ptr<sznet::net::TcpConnection,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  conn.super___shared_ptr<sznet::net::TcpConnection,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)operator_new(0x18);
  (conn.super___shared_ptr<sznet::net::TcpConnection,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi)
  ->_vptr__Sp_counted_base =
       (_func_int **)LengthHeaderCodec<std::shared_ptr<sznet::net::TcpConnection>_>::onMessage;
  (conn.super___shared_ptr<sznet::net::TcpConnection,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi)
  ->_M_use_count = 0;
  (conn.super___shared_ptr<sznet::net::TcpConnection,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi)
  ->_M_weak_count = 0;
  conn.super___shared_ptr<sznet::net::TcpConnection,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi
  [1]._vptr__Sp_counted_base = (_func_int **)&this->m_tcpCodec;
  std::
  function<void_(const_std::shared_ptr<sznet::net::TcpConnection>_&,_sznet::net::Buffer_*,_sznet::Timestamp)>
  ::operator=((function<void_(const_std::shared_ptr<sznet::net::TcpConnection>_&,_sznet::net::Buffer_*,_sznet::Timestamp)>
               *)(uVar3 + 0xb0),
              (function<void_(const_std::shared_ptr<sznet::net::TcpConnection>_&,_sznet::net::Buffer_*,_sznet::Timestamp)>
               *)&conn.super___shared_ptr<sznet::net::TcpConnection,_(__gnu_cxx::_Lock_policy)2>.
                  _M_refcount);
  p_Var1 = &conn.super___shared_ptr<sznet::net::TcpConnection,_(__gnu_cxx::_Lock_policy)2>.
            _M_refcount;
  std::
  _Function_handler<void_(const_std::shared_ptr<sznet::net::TcpConnection>_&,_sznet::net::Buffer_*,_sznet::Timestamp),_std::_Bind<void_(sznet::net::LengthHeaderCodec<std::shared_ptr<sznet::net::TcpConnection>_>::*(sznet::net::LengthHeaderCodec<std::shared_ptr<sznet::net::TcpConnection>_>_*,_std::_Placeholder<1>,_std::_Placeholder<2>,_std::_Placeholder<3>))(const_std::shared_ptr<sznet::net::TcpConnection>_&,_sznet::net::Buffer_*,_sznet::Timestamp)>_>
  ::_M_manager((_Any_data *)p_Var1,(_Any_data *)p_Var1,__destroy_functor);
  uVar3 = connName.field_2._8_8_;
  conn.super___shared_ptr<sznet::net::TcpConnection,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  conn.super___shared_ptr<sznet::net::TcpConnection,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)operator_new(0x18);
  (conn.super___shared_ptr<sznet::net::TcpConnection,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi)
  ->_vptr__Sp_counted_base = (_func_int **)removeTcpConnection;
  (conn.super___shared_ptr<sznet::net::TcpConnection,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi)
  ->_M_use_count = 0;
  (conn.super___shared_ptr<sznet::net::TcpConnection,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi)
  ->_M_weak_count = 0;
  conn.super___shared_ptr<sznet::net::TcpConnection,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi
  [1]._vptr__Sp_counted_base = (_func_int **)this;
  std::function<void_(const_std::shared_ptr<sznet::net::TcpConnection>_&)>::operator=
            ((function<void_(const_std::shared_ptr<sznet::net::TcpConnection>_&)> *)(uVar3 + 0x110),
             (function<void_(const_std::shared_ptr<sznet::net::TcpConnection>_&)> *)
             &conn.super___shared_ptr<sznet::net::TcpConnection,_(__gnu_cxx::_Lock_policy)2>.
              _M_refcount);
  p_Var1 = &conn.super___shared_ptr<sznet::net::TcpConnection,_(__gnu_cxx::_Lock_policy)2>.
            _M_refcount;
  std::
  _Function_handler<void_(const_std::shared_ptr<sznet::net::TcpConnection>_&),_std::_Bind<void_(sznet::net::KcpWithTcpClient::*(sznet::net::KcpWithTcpClient_*,_std::_Placeholder<1>))(const_std::shared_ptr<sznet::net::TcpConnection>_&)>_>
  ::_M_manager((_Any_data *)p_Var1,(_Any_data *)p_Var1,__destroy_functor);
  mutex = &this->m_mutex;
  sz_mutex_lock(&mutex->m_mutex);
  MutexLock::assignHolder(mutex);
  (this->m_tcpConnection).super___shared_ptr<sznet::net::TcpConnection,_(__gnu_cxx::_Lock_policy)2>.
  _M_ptr = (element_type *)connName.field_2._8_8_;
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::operator=
            (&(this->m_tcpConnection).
              super___shared_ptr<sznet::net::TcpConnection,_(__gnu_cxx::_Lock_policy)2>._M_refcount,
             (__shared_count<(__gnu_cxx::_Lock_policy)2> *)&conn);
  (this->m_mutex).m_holder = 0;
  sz_mutex_unlock(&mutex->m_mutex);
  TcpConnection::connectEstablished((TcpConnection *)connName.field_2._8_8_);
  if (conn.super___shared_ptr<sznet::net::TcpConnection,_(__gnu_cxx::_Lock_policy)2>._M_ptr !=
      (element_type *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
               conn.super___shared_ptr<sznet::net::TcpConnection,_(__gnu_cxx::_Lock_policy)2>._M_ptr
              );
  }
  if (stack0xffffffffffffff78 != &connName._M_string_length) {
    operator_delete(stack0xffffffffffffff78);
  }
  return;
}

Assistant:

void KcpWithTcpClient::newTcpConnection(sockets::sz_sock sockfd)
{
	m_loop->assertInLoopThread();
	InetAddress peerAddr(sockets::sz_sock_getpeeraddr(sockfd));
	char buf[32];
	uint32_t connId = m_nextConnId++;
	snprintf(buf, sizeof(buf), ":tcp-%s#%d", peerAddr.toIpPort().c_str(), connId);
	string connName = m_name + buf;

	InetAddress localAddr(sockets::sz_sock_getlocaladdr(sockfd));
	// FIXME poll with zero timeout to double confirm the new connection
	// FIXME use make_shared if necessary
	TcpConnectionPtr conn(new TcpConnection(m_loop, connName, connId, sockfd, localAddr, peerAddr));
	conn->setMessageCallback(std::bind(&LengthHeaderCodec<>::onMessage, &m_tcpCodec, std::placeholders::_1, std::placeholders::_2, std::placeholders::_3));
	// FIXME: unsafe
	conn->setCloseCallback(std::bind(&KcpWithTcpClient::removeTcpConnection, this, std::placeholders::_1));
	// ��������ͬʱ��д����race condition
	{
		MutexLockGuard lock(m_mutex);
		m_tcpConnection = conn;
	}
	conn->connectEstablished();
}